

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_Swap_Test
          (HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  (this->
  super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__HashtableTest_00c262c8;
  (this->
  super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c26388;
  google::
  dense_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~dense_hashtable(&(this->
                      super_HashtableAllTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      ).
                      super_HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      .ht_.
                      super_BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      .ht_.rep);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}